

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O2

PatternList *
parse_short(PatternList *__return_storage_ptr__,Tokens *tokens,
           vector<docopt::Option,_std::allocator<docopt::Option>_> *options)

{
  pointer pOVar1;
  bool bVar2;
  __type_conflict _Var3;
  string *psVar4;
  OptionError *pOVar5;
  undefined8 uVar6;
  Option *option;
  pointer pOVar7;
  string local_178;
  string local_158;
  string local_138;
  undefined1 local_118 [8];
  string shortOpt;
  shared_ptr<docopt::Option> o;
  undefined1 local_d8 [8];
  string token;
  vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> similar;
  Kind local_98;
  undefined4 uStack_94;
  string error;
  undefined1 local_70 [8];
  value val;
  PatternList *ret;
  
  Tokens::pop_abi_cxx11_((string *)local_d8,tokens);
  std::__cxx11::string::string((string *)local_70,"-",(allocator *)&stack0xffffffffffffff68);
  bVar2 = anon_unknown.dwarf_4e28d::starts_with((string *)local_d8,(string *)local_70);
  if (!bVar2) {
    __assert_fail("starts_with(token, \"-\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/stevschmid[P]nsearch/nsearch/vendor/docopt/docopt.cpp"
                  ,0x120,"PatternList parse_short(Tokens &, std::vector<Option> &)");
  }
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::string((string *)local_70,"--",(allocator *)&stack0xffffffffffffff68);
  bVar2 = anon_unknown.dwarf_4e28d::starts_with((string *)local_d8,(string *)local_70);
  if (bVar2) {
    __assert_fail("!starts_with(token, \"--\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/stevschmid[P]nsearch/nsearch/vendor/docopt/docopt.cpp"
                  ,0x121,"PatternList parse_short(Tokens &, std::vector<Option> &)");
  }
  std::__cxx11::string::~string((string *)local_70);
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar6 = (byte *)((long)local_d8 + 1);
  do {
    if ((pointer)uVar6 == token._M_dataplus._M_p + (long)local_d8) {
      std::__cxx11::string::~string((string *)local_d8);
      return __return_storage_ptr__;
    }
    local_118 = (undefined1  [8])&shortOpt._M_string_length;
    shortOpt._M_string_length._0_2_ = (ushort)*(byte *)uVar6 << 8 | 0x2d;
    shortOpt._M_dataplus._M_p = (pointer)0x2;
    shortOpt._M_string_length._2_1_ = 0;
    val.variant._24_8_ = uVar6 + 1;
    token.field_2._8_8_ = 0;
    pOVar1 = (options->super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pOVar7 = (options->super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>).
                  _M_impl.super__Vector_impl_data._M_start; pOVar7 != pOVar1; pOVar7 = pOVar7 + 1) {
      _Var3 = std::operator==(&pOVar7->fShortOption,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_118);
      if (_Var3) {
        local_70 = (undefined1  [8])pOVar7;
        std::vector<docopt::Option_const*,std::allocator<docopt::Option_const*>>::
        emplace_back<docopt::Option_const*>
                  ((vector<docopt::Option_const*,std::allocator<docopt::Option_const*>> *)
                   (token.field_2._M_local_buf + 8),(Option **)local_70);
      }
    }
    if (8 < (ulong)-token.field_2._8_8_) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&shortOpt.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                     " is specified ambiguously ");
      std::__cxx11::to_string(&local_158,(long)-token.field_2._8_8_ >> 3);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&shortOpt.field_2 + 8),&local_158);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff68," times");
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)(shortOpt.field_2._M_local_buf + 8));
      pOVar5 = (OptionError *)__cxa_allocate_exception(0x10);
      Tokens::OptionError::runtime_error(pOVar5,(string *)local_70);
      __cxa_throw(pOVar5,&Tokens::OptionError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (token.field_2._8_8_ == 0) {
      local_70 = (undefined1  [8])((ulong)local_70 & 0xffffffff00000000);
      std::vector<docopt::Option,std::allocator<docopt::Option>>::
      emplace_back<std::__cxx11::string&,char_const(&)[1],int>
                ((vector<docopt::Option,std::allocator<docopt::Option>> *)options,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                 (char (*) [1])0x156cd1,(int *)local_70);
      std::make_shared<docopt::Option,docopt::Option&>((Option *)&stack0xffffffffffffff68);
      if (tokens->fIsParsingArgv == true) {
        local_70._0_4_ = 1;
        val.kind._0_1_ = Bool;
        docopt::value::operator=((value *)(CONCAT44(uStack_94,local_98) + 0x28),(value *)local_70);
        docopt::value::~value((value *)local_70);
      }
      std::__shared_ptr<docopt::Pattern,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<docopt::Option,void>
                ((__shared_ptr<docopt::Pattern,(__gnu_cxx::_Lock_policy)2> *)local_70,
                 (__shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2> *)
                 &stack0xffffffffffffff68);
      std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
      ::emplace_back<std::shared_ptr<docopt::Pattern>>
                ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                  *)__return_storage_ptr__,(shared_ptr<docopt::Pattern> *)local_70);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&val);
      psVar4 = &error;
    }
    else {
      std::make_shared<docopt::Option,docopt::Option_const&>
                ((Option *)((long)&shortOpt.field_2 + 8));
      local_70 = (undefined1  [8])((ulong)local_70 & 0xffffffff00000000);
      if (*(int *)(shortOpt.field_2._8_8_ + 0x90) != 0) {
        if (val.variant._24_8_ == token._M_dataplus._M_p + (long)local_d8) {
          psVar4 = Tokens::current_abi_cxx11_(tokens);
          if (psVar4->_M_string_length == 0) {
LAB_0013f1ef:
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stack0xffffffffffffff68,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_118," requires an argument");
            pOVar5 = (OptionError *)__cxa_allocate_exception(0x10);
            Tokens::OptionError::runtime_error(pOVar5,(string *)&stack0xffffffffffffff68);
            __cxa_throw(pOVar5,&Tokens::OptionError::typeinfo,std::runtime_error::~runtime_error);
          }
          bVar2 = std::operator==(psVar4,"--");
          if (bVar2) goto LAB_0013f1ef;
          Tokens::pop_abi_cxx11_(&local_178,tokens);
          docopt::value::value((value *)&stack0xffffffffffffff68,&local_178);
          docopt::value::operator=((value *)local_70,(value *)&stack0xffffffffffffff68);
          docopt::value::~value((value *)&stack0xffffffffffffff68);
          std::__cxx11::string::~string((string *)&local_178);
        }
        else {
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    ((string *)&local_138);
          docopt::value::value((value *)&stack0xffffffffffffff68,&local_138);
          docopt::value::operator=((value *)local_70,(value *)&stack0xffffffffffffff68);
          docopt::value::~value((value *)&stack0xffffffffffffff68);
          std::__cxx11::string::~string((string *)&local_138);
          val.variant._24_8_ = token._M_dataplus._M_p + (long)local_d8;
        }
      }
      uVar6 = shortOpt.field_2._8_8_;
      if (tokens->fIsParsingArgv == true) {
        if (local_70._0_4_ == Empty) {
          local_98 = Bool;
          error._M_dataplus._M_p._0_1_ = 1;
        }
        else {
          docopt::value::value((value *)&stack0xffffffffffffff68,(value *)local_70);
        }
        docopt::value::operator=((value *)(uVar6 + 0x28),(value *)&stack0xffffffffffffff68);
        docopt::value::~value((value *)&stack0xffffffffffffff68);
      }
      std::__shared_ptr<docopt::Pattern,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<docopt::Option,void>
                ((__shared_ptr<docopt::Pattern,(__gnu_cxx::_Lock_policy)2> *)
                 &stack0xffffffffffffff68,
                 (__shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&shortOpt.field_2 + 8));
      std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
      ::emplace_back<std::shared_ptr<docopt::Pattern>>
                ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                  *)__return_storage_ptr__,(shared_ptr<docopt::Pattern> *)&stack0xffffffffffffff68);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&error);
      docopt::value::~value((value *)local_70);
      psVar4 = (string *)&o;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)psVar4);
    std::_Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>::
    ~_Vector_base((_Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> *)
                  ((long)&token.field_2 + 8));
    std::__cxx11::string::~string((string *)local_118);
    uVar6 = val.variant._24_8_;
  } while( true );
}

Assistant:

static PatternList parse_short(Tokens& tokens, std::vector<Option>& options)
{
	// shorts ::= '-' ( chars )* [ [ ' ' ] chars ] ;

	auto token = tokens.pop();

	assert(starts_with(token, "-"));
	assert(!starts_with(token, "--"));

	auto i = token.begin();
	++i; // skip the leading '-'

	PatternList ret;
	while (i != token.end()) {
		std::string shortOpt = { '-', *i };
		++i;

		std::vector<Option const*> similar;
		for(auto const& option : options) {
			if (option.shortOption()==shortOpt)
				similar.push_back(&option);
		}

		if (similar.size() > 1) {
			std::string error = shortOpt + " is specified ambiguously "
			+ std::to_string(similar.size()) + " times";
			throw Tokens::OptionError(std::move(error));
		} else if (similar.empty()) {
			options.emplace_back(shortOpt, "", 0);

			auto o = std::make_shared<Option>(options.back());
			if (tokens.isParsingArgv()) {
				o->setValue(value{true});
			}
			ret.push_back(o);
		} else {
			auto o = std::make_shared<Option>(*similar[0]);
			value val;
			if (o->argCount()) {
				if (i == token.end()) {
					// consume the next token
					auto const& ttoken = tokens.current();
					if (ttoken.empty() || ttoken=="--") {
						std::string error = shortOpt + " requires an argument";
						throw Tokens::OptionError(std::move(error));
					}
					val = tokens.pop();
				} else {
					// consume all the rest
					val = std::string{i, token.end()};
					i = token.end();
				}
			}

			if (tokens.isParsingArgv()) {
				o->setValue(val ? std::move(val) : value{true});
			}
			ret.push_back(o);
		}
	}

	return ret;
}